

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O1

void __thiscall UnifiedRegex::Matcher::DoQueryContinue(Matcher *this,uint qcTicks)

{
  Type TVar1;
  RegexPattern *this_00;
  code *pcVar2;
  bool bVar3;
  DWORD now;
  undefined4 *puVar4;
  ScriptContext *pSVar5;
  undefined1 local_38 [8];
  AutoCleanup autoCleanup;
  
  TVar1 = this->previousQcTime;
  now = GetTickCount();
  if (((TVar1 != 0) && (TimePerQc <= now - TVar1)) || ((TicksPerQc - 1U & qcTicks) == 0)) {
    this->previousQcTime = now;
    TraceQueryContinue(now);
    this_00 = (this->pattern).ptr;
    local_38 = (undefined1  [8])this_00;
    autoCleanup.pattern = (RegexPattern *)this;
    if (this_00 == (RegexPattern *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                         ,4999,"(pattern)","pattern");
      if (!bVar3) goto LAB_00efa415;
      *puVar4 = 0;
    }
    if ((this_00->rep).unified.matcher.ptr != this) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                         ,0x1389,"(pattern->rep.unified.matcher == matcher)",
                         "pattern->rep.unified.matcher == matcher");
      if (!bVar3) {
LAB_00efa415:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    (this_00->rep).unified.matcher.ptr = (Matcher *)0x0;
    pSVar5 = RegexPattern::GetScriptContext(this_00);
    autoCleanup.matcher = (Matcher *)Js::ScriptContext::SaveRegexStacks(pSVar5);
    pSVar5 = RegexPattern::GetScriptContext((this->pattern).ptr);
    ThreadContext::CheckScriptInterrupt(pSVar5->threadContext);
    DoQueryContinue::AutoCleanup::~AutoCleanup((AutoCleanup *)local_38);
  }
  return;
}

Assistant:

void Matcher::DoQueryContinue(const uint qcTicks)
    {
        // See definition of TimePerQc for description of regex QC heuristics

        const uint before = previousQcTime;
        const uint now = GetTickCount();
        if ((!before || now - before < TimePerQc) && qcTicks & TicksPerQc - 1)
        {
            return;
        }

        previousQcTime = now;
        TraceQueryContinue(now);

        // Query-continue can be reentrant and run the same regex again. To prevent the matcher and other persistent objects
        // from being reused reentrantly, save and restore them around the QC call.
        class AutoCleanup
        {
        private:
            RegexPattern *const pattern;
            Matcher *const matcher;
            RegexStacks * regexStacks;

        public:
            AutoCleanup(RegexPattern *const pattern, Matcher *const matcher) : pattern(pattern), matcher(matcher)
            {
                Assert(pattern);
                Assert(matcher);
                Assert(pattern->rep.unified.matcher == matcher);

                pattern->rep.unified.matcher = nullptr;

                const auto scriptContext = pattern->GetScriptContext();
                regexStacks = scriptContext->SaveRegexStacks();
            }

            ~AutoCleanup()
            {
                pattern->rep.unified.matcher = matcher;

                const auto scriptContext = pattern->GetScriptContext();
                scriptContext->RestoreRegexStacks(regexStacks);
            }
        } autoCleanup(pattern, this);

        pattern->GetScriptContext()->GetThreadContext()->CheckScriptInterrupt();
    }